

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update3sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps3,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec3,int *idx3,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs3,int *ridx3,int *rn3,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  fpclass_type fVar2;
  int *heap;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int local_614;
  int *local_610;
  int *local_608;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_600;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5f8;
  int32_t local_5f0;
  int local_5ec;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5e8;
  int *local_5e0;
  int *local_5d8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_88.m_backend.exp = (eps->m_backend).exp;
  local_88.m_backend.neg = (eps->m_backend).neg;
  local_88.m_backend.fpclass = (eps->m_backend).fpclass;
  local_88.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_d8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_d8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_d8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_d8.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_d8.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_d8.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
  local_d8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
  local_d8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
  local_d8.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._48_8_;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 8)
  ;
  local_128.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x10);
  local_128.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x18);
  local_128.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x20);
  local_128.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x28);
  local_128.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x30);
  local_128.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x38);
  local_128.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x40);
  local_128.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._48_8_ + 0x44);
  local_128.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x48);
  local_610 = ridx;
  local_600 = rhs;
  local_5f8 = eps;
  local_5e8 = vec;
  local_5e0 = idx;
  vSolveLright3(this,rhs,ridx,rn,&local_88,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._24_8_,(int *)eps2.m_backend.data._M_elems._32_8_,
                (int *)eps2.m_backend.data._M_elems._40_8_,&local_d8,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend._72_8_,(int *)vec2,idx2,&local_128);
  local_608 = (this->row).perm;
  local_614 = 0;
  local_5d0 = this;
  if (rhs2 == (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)0x0) {
    lVar9 = 0;
    while( true ) {
      pnVar3 = local_600;
      heap = local_610;
      if (*rn <= lVar9) break;
      iVar6 = local_610[lVar9];
      local_5c8 = *(undefined8 *)local_600[iVar6].m_backend.data._M_elems;
      uStack_5c0 = *(undefined8 *)(local_600[iVar6].m_backend.data._M_elems + 2);
      puVar1 = local_600[iVar6].m_backend.data._M_elems + 4;
      local_5b8 = *(undefined8 *)puVar1;
      uStack_5b0 = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_600[iVar6].m_backend.data._M_elems + 8;
      local_5a8 = *(undefined8 *)puVar1;
      uStack_5a0 = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_600[iVar6].m_backend.data._M_elems + 0xc;
      local_598 = *(undefined8 *)puVar1;
      uStack_590 = *(undefined8 *)(puVar1 + 2);
      local_3a8.m_backend.exp = local_600[iVar6].m_backend.exp;
      local_3a8.m_backend.neg = local_600[iVar6].m_backend.neg;
      local_3a8.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)local_600[iVar6].m_backend.data._M_elems;
      local_3a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(local_600[iVar6].m_backend.data._M_elems + 2);
      puVar1 = local_600[iVar6].m_backend.data._M_elems + 4;
      local_3a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_3a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_600[iVar6].m_backend.data._M_elems + 8;
      local_3a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_3a8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_600[iVar6].m_backend.data._M_elems + 0xc;
      local_3a8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_3a8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_3a8.m_backend.fpclass = local_600[iVar6].m_backend.fpclass;
      local_3a8.m_backend.prec_elem = local_600[iVar6].m_backend.prec_elem;
      local_3f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_5f8->m_backend).data._M_elems;
      local_3f8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 2);
      local_3f8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 4);
      local_3f8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 6);
      local_3f8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 8);
      local_3f8.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 10);
      local_3f8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 0xc);
      local_3f8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 0xe);
      local_3f8.m_backend.exp = (local_5f8->m_backend).exp;
      local_3f8.m_backend.neg = (local_5f8->m_backend).neg;
      local_3f8.m_backend.fpclass = (local_5f8->m_backend).fpclass;
      local_3f8.m_backend.prec_elem = (local_5f8->m_backend).prec_elem;
      bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_3a8,&local_3f8);
      if (bVar5) {
        enQueueMax(heap,&local_614,local_608[iVar6]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&pnVar3[iVar6].m_backend,0);
      }
      lVar9 = lVar9 + 1;
    }
    *rn = local_614;
  }
  else {
    local_5d8 = rn2;
    for (lVar9 = 0; pnVar3 = local_600, lVar9 < *rn; lVar9 = lVar9 + 1) {
      iVar6 = local_610[lVar9];
      local_5c8 = *(undefined8 *)local_600[iVar6].m_backend.data._M_elems;
      uStack_5c0 = *(undefined8 *)(local_600[iVar6].m_backend.data._M_elems + 2);
      puVar1 = local_600[iVar6].m_backend.data._M_elems + 4;
      local_5b8 = *(undefined8 *)puVar1;
      uStack_5b0 = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_600[iVar6].m_backend.data._M_elems + 8;
      local_5a8 = *(undefined8 *)puVar1;
      uStack_5a0 = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_600[iVar6].m_backend.data._M_elems + 0xc;
      local_598 = *(undefined8 *)puVar1;
      uStack_590 = *(undefined8 *)(puVar1 + 2);
      local_5ec = local_600[iVar6].m_backend.exp;
      bVar5 = local_600[iVar6].m_backend.neg;
      fVar2 = local_600[iVar6].m_backend.fpclass;
      local_5f0 = local_600[iVar6].m_backend.prec_elem;
      local_588.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)local_600[iVar6].m_backend.data._M_elems;
      local_588.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(local_600[iVar6].m_backend.data._M_elems + 2);
      puVar1 = local_600[iVar6].m_backend.data._M_elems + 4;
      local_588.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_588.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_600[iVar6].m_backend.data._M_elems + 8;
      local_588.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_588.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_600[iVar6].m_backend.data._M_elems + 0xc;
      local_588.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_588.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_358.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_5f8->m_backend).data._M_elems;
      local_358.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 2);
      local_358.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 4);
      local_358.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 6);
      local_358.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 8);
      local_358.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 10);
      local_358.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 0xc);
      local_358.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((local_5f8->m_backend).data._M_elems + 0xe);
      local_358.m_backend.exp = (local_5f8->m_backend).exp;
      local_358.m_backend.neg = (local_5f8->m_backend).neg;
      local_358.m_backend.fpclass = (local_5f8->m_backend).fpclass;
      local_358.m_backend.prec_elem = (local_5f8->m_backend).prec_elem;
      local_588.m_backend.exp = local_5ec;
      local_588.m_backend.neg = bVar5;
      local_588.m_backend.fpclass = fVar2;
      local_588.m_backend.prec_elem = local_5f0;
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_588,&local_358);
      if (bVar4) {
        *local_5d8 = iVar6;
        local_5d8 = local_5d8 + 1;
        enQueueMax(local_610,&local_614,local_608[iVar6]);
        puVar1 = rhs2[iVar6].m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar1 = local_598;
        *(undefined8 *)(puVar1 + 2) = uStack_590;
        puVar1 = rhs2[iVar6].m_backend.data._M_elems + 8;
        *(undefined8 *)puVar1 = local_5a8;
        *(undefined8 *)(puVar1 + 2) = uStack_5a0;
        puVar1 = rhs2[iVar6].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = local_5b8;
        *(undefined8 *)(puVar1 + 2) = uStack_5b0;
        *(undefined8 *)rhs2[iVar6].m_backend.data._M_elems = local_5c8;
        *(undefined8 *)(rhs2[iVar6].m_backend.data._M_elems + 2) = uStack_5c0;
        rhs2[iVar6].m_backend.exp = local_5ec;
        rhs2[iVar6].m_backend.neg = bVar5;
        rhs2[iVar6].m_backend.fpclass = fVar2;
        rhs2[iVar6].m_backend.prec_elem = local_5f0;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&pnVar3[iVar6].m_backend,0);
      }
    }
    *rn = local_614;
    *ridx2 = local_614;
  }
  local_614 = 0;
  for (lVar9 = 0; lVar9 < *(int *)eps2.m_backend.data._M_elems._40_8_; lVar9 = lVar9 + 1) {
    lVar7 = (long)*(int *)(eps2.m_backend.data._M_elems._32_8_ + lVar9 * 4);
    lVar8 = lVar7 * 0x50;
    local_448.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._24_8_ + 0x40 + lVar8);
    local_448.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._24_8_ + 0x44 + lVar8);
    local_448.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + lVar8);
    local_448.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._24_8_ + lVar8) + 2);
    puVar1 = (uint *)(eps2.m_backend.data._M_elems._24_8_ + 0x10 + lVar8);
    local_448.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_448.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(eps2.m_backend.data._M_elems._24_8_ + 0x20 + lVar8);
    local_448.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_448.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(eps2.m_backend.data._M_elems._24_8_ + 0x30 + lVar8);
    local_448.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_448.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_448.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x48 + lVar8)
    ;
    local_498.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
    local_498.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
    local_498.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
    local_498.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
    local_498.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
    local_498.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
    local_498.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
    local_498.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
    local_498.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
    local_498.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
    local_498.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
    bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_448,&local_498);
    if (bVar5) {
      enQueueMax((int *)eps2.m_backend.data._M_elems._32_8_,&local_614,local_608[lVar7]);
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)(lVar8 + eps2.m_backend.data._M_elems._24_8_),0);
    }
  }
  *(int *)eps2.m_backend.data._M_elems._40_8_ = local_614;
  local_614 = 0;
  for (lVar9 = 0; this_00 = local_5d0, pnVar3 = local_5f8, lVar9 < *idx2; lVar9 = lVar9 + 1) {
    lVar7 = (long)(int)(vec2->m_backend).data._M_elems[lVar9];
    lVar8 = lVar7 * 0x50;
    local_4e8.m_backend.exp = *(int *)(eps2.m_backend._72_8_ + 0x40 + lVar8);
    local_4e8.m_backend.neg = *(bool *)(eps2.m_backend._72_8_ + 0x44 + lVar8);
    local_4e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2.m_backend._72_8_ + lVar8);
    local_4e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((uint *)(eps2.m_backend._72_8_ + lVar8) + 2);
    puVar1 = (uint *)(eps2.m_backend._72_8_ + 0x10 + lVar8);
    local_4e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_4e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(eps2.m_backend._72_8_ + 0x20 + lVar8);
    local_4e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_4e8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(eps2.m_backend._72_8_ + 0x30 + lVar8);
    local_4e8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_4e8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_4e8.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend._72_8_ + 0x48 + lVar8);
    local_538.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._48_8_;
    local_538.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 8);
    local_538.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x10);
    local_538.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x18);
    local_538.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x20);
    local_538.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x28);
    local_538.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x30);
    local_538.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x38);
    local_538.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x40);
    local_538.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._48_8_ + 0x44);
    local_538.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x48);
    bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_4e8,&local_538);
    if (bVar5) {
      enQueueMax((int *)vec2,&local_614,local_608[lVar7]);
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)(lVar8 + eps2.m_backend._72_8_),0);
    }
  }
  *idx2 = local_614;
  local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_5f8->m_backend).data._M_elems;
  local_178.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((local_5f8->m_backend).data._M_elems + 2);
  local_178.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((local_5f8->m_backend).data._M_elems + 4);
  local_178.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((local_5f8->m_backend).data._M_elems + 6);
  local_178.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((local_5f8->m_backend).data._M_elems + 8);
  local_178.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)((local_5f8->m_backend).data._M_elems + 10);
  local_178.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)((local_5f8->m_backend).data._M_elems + 0xc);
  local_178.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)((local_5f8->m_backend).data._M_elems + 0xe);
  local_178.m_backend.exp = (local_5f8->m_backend).exp;
  local_178.m_backend.neg = (local_5f8->m_backend).neg;
  local_178.m_backend.fpclass = (local_5f8->m_backend).fpclass;
  local_178.m_backend.prec_elem = (local_5f8->m_backend).prec_elem;
  iVar6 = vSolveUright(local_5d0,local_5e8,local_5e0,local_600,local_610,*rn,&local_178);
  *rn = iVar6;
  local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_1c8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_1c8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_1c8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_1c8.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_1c8.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_1c8.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
  local_1c8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
  local_1c8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
  local_1c8.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
  iVar6 = vSolveUright(this_00,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)eps2.m_backend.data._M_elems._8_8_,
                       (int *)eps2.m_backend.data._M_elems._16_8_,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)eps2.m_backend.data._M_elems._24_8_,
                       (int *)eps2.m_backend.data._M_elems._32_8_,
                       *(int *)eps2.m_backend.data._M_elems._40_8_,&local_1c8);
  *(int *)eps2.m_backend.data._M_elems._40_8_ = iVar6;
  local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._48_8_;
  local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 8)
  ;
  local_218.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x10);
  local_218.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x18);
  local_218.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x20);
  local_218.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x28);
  local_218.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x30);
  local_218.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x38);
  local_218.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x40);
  local_218.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._48_8_ + 0x44);
  local_218.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x48);
  iVar6 = vSolveUright(this_00,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)eps2.m_backend.data._M_elems._56_8_,(int *)eps2.m_backend._64_8_,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)eps2.m_backend._72_8_,(int *)vec2,*idx2,&local_218);
  *idx2 = iVar6;
  if ((this_00->l).updateType == 0) {
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
    local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 2)
    ;
    local_268.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((pnVar3->m_backend).data._M_elems + 4);
    local_268.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((pnVar3->m_backend).data._M_elems + 6);
    local_268.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar3->m_backend).data._M_elems + 8);
    local_268.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((pnVar3->m_backend).data._M_elems + 10);
    local_268.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((pnVar3->m_backend).data._M_elems + 0xc);
    local_268.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((pnVar3->m_backend).data._M_elems + 0xe);
    local_268.m_backend.exp = (pnVar3->m_backend).exp;
    local_268.m_backend.neg = (pnVar3->m_backend).neg;
    local_268.m_backend.fpclass = (pnVar3->m_backend).fpclass;
    local_268.m_backend.prec_elem = (pnVar3->m_backend).prec_elem;
    iVar6 = vSolveUpdateRight(this_00,local_5e8,local_5e0,*rn,&local_268);
    *rn = iVar6;
    local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
    local_2b8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
    local_2b8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
    local_2b8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
    local_2b8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
    local_2b8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
    local_2b8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
    local_2b8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
    local_2b8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
    local_2b8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
    local_2b8.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
    iVar6 = vSolveUpdateRight(this_00,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)eps2.m_backend.data._M_elems._8_8_,
                              (int *)eps2.m_backend.data._M_elems._16_8_,
                              *(int *)eps2.m_backend.data._M_elems._40_8_,&local_2b8);
    *(int *)eps2.m_backend.data._M_elems._40_8_ = iVar6;
    local_308.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._48_8_;
    local_308.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 8);
    local_308.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x10);
    local_308.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x18);
    local_308.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x20);
    local_308.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x28);
    local_308.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x30);
    local_308.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x38);
    local_308.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x40);
    local_308.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._48_8_ + 0x44);
    local_308.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x48);
    iVar6 = vSolveUpdateRight(this_00,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)eps2.m_backend.data._M_elems._56_8_,
                              (int *)eps2.m_backend._64_8_,*idx2,&local_308);
    *idx2 = iVar6;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update3sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R eps3, R* vec3, int* idx3,     /* result3 */
      R* rhs3, int* ridx3, int& rn3,     /* rhs3    */
      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   for(i = j = 0; i < rn3; ++i)
   {
      k = ridx3[i];
      assert(k >= 0 && k < thedim);
      x = rhs3[k];

      if(isNotZero(x, eps3))
         enQueueMax(ridx3, &j, rperm[k]);
      else
         rhs3[k] = 0;
   }

   rn3 = j;

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);
   rn3 = vSolveUright(vec3, idx3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
      rn3 = vSolveUpdateRight(vec3, idx3, rn3, eps3);
   }
}